

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::BinaryExpression::fromComponents
          (Expression *lhs,Expression *rhs,BinaryOperator op,SourceRange opRange,
          SourceRange sourceRange,ASTContext *context)

{
  Compilation *pCVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ExpressionSyntax *pEVar19;
  long lVar20;
  long lVar21;
  Type *rhs_00;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  SourceRange sourceRange_00;
  SourceRange opRange_00;
  SourceRange opRange_01;
  SourceRange opRange_02;
  SourceRange opRange_03;
  SourceRange opRange_04;
  SourceRange opRange_05;
  SourceRange opRange_06;
  SourceRange opRange_07;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> extraDiagArg;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  SourceRange sourceRange_03;
  Expression *pEVar26;
  bool bVar27;
  byte bVar28;
  bool bVar29;
  bitwidth_t bVar30;
  BinaryExpression *expr;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Compilation *pCVar31;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  Expression *pEVar32;
  Diagnostic *pDVar33;
  Expression *pEVar34;
  Diagnostic *pDVar35;
  char cVar36;
  ulong uVar37;
  long lVar38;
  Type *pTVar39;
  Type *forceType;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  SourceLocation SVar40;
  DiagCode code;
  undefined4 uVar41;
  Compilation *pCVar42;
  SourceLocation SVar43;
  char *pcVar44;
  Expression *pEVar45;
  size_t sVar46;
  byte bVar47;
  UnaryExpression *unary;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  string_view sVar48;
  string_view arg;
  string_view arg_00;
  SourceRange range_03;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  Type *lt;
  Type *rt;
  anon_class_24_3_e32f0a13 warnAWithinB;
  anon_class_24_3_21991733 check;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *args_5;
  undefined4 uVar49;
  SourceLocation in_stack_fffffffffffffe90;
  Compilation *local_130;
  Compilation *local_128;
  undefined8 local_120;
  char *local_118;
  SourceLocation local_110;
  BinaryOperator local_104;
  undefined8 local_100;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  local_f8;
  BinaryOperator local_e0;
  undefined1 local_d9 [9];
  SourceLocation SStack_d0;
  Diagnostic *local_c0;
  Expression *local_b8;
  size_t local_b0;
  SourceLocation local_a8;
  char *local_a0;
  SourceLocation local_98;
  SourceLocation SStack_90;
  char *local_88;
  SourceLocation local_80;
  SourceLocation local_78;
  anon_class_64_8_451f4118 local_70;
  
  local_f8.first._M_str = (char *)opRange.endLoc;
  local_f8.first._M_len = (size_t)opRange.startLoc;
  args_5 = &local_f8;
  pCVar1 = ((context->scope).ptr)->compilation;
  local_130 = (Compilation *)(lhs->type).ptr;
  local_128 = (Compilation *)(rhs->type).ptr;
  local_e0 = op;
  expr = BumpAllocator::
         emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
                   (&pCVar1->super_BumpAllocator,&local_e0,(Type *)local_130,lhs,rhs,&sourceRange,
                    (SourceRange *)args_5);
  bVar27 = Expression::bad(lhs);
  if ((bVar27) || (bVar27 = Expression::bad(rhs), pCVar31 = local_130, bVar27)) goto LAB_004340dd;
  lVar38._0_4_ = (local_130->options).typoCorrectionLimit;
  lVar38._4_4_ = (local_130->options).minTypMax;
  local_110 = (SourceLocation)context;
  if (lVar38 == 0) {
    Type::resolveCanonical((Type *)local_130);
  }
  pCVar42 = local_128;
  if (**(int **)&(pCVar31->options).typoCorrectionLimit == 0x1d) {
    local_130 = (Compilation *)pCVar1->intType;
  }
  lVar2._0_4_ = (local_128->options).typoCorrectionLimit;
  lVar2._4_4_ = (local_128->options).minTypMax;
  if (lVar2 == 0) {
    Type::resolveCanonical((Type *)local_128);
  }
  if (**(int **)&(pCVar42->options).typoCorrectionLimit == 0x1d) {
    local_128 = (Compilation *)pCVar1->intType;
  }
  bVar27 = Type::isIntegral((Type *)local_130);
  SVar43 = local_110;
  if (bVar27) {
    bVar27 = Type::isIntegral((Type *)local_128);
    local_120 = (Type *)CONCAT44(local_120._4_4_,(int)CONCAT71(extraout_var,bVar27));
  }
  else {
    local_120 = (Type *)((ulong)local_120._4_4_ << 0x20);
  }
  bVar27 = Type::isNumeric((Type *)local_130);
  if (bVar27) {
    bVar27 = Type::isNumeric((Type *)local_128);
    local_100 = (Type *)CONCAT44(local_100._4_4_,(int)CONCAT71(extraout_var_00,bVar27));
  }
  else {
    local_100 = (Type *)((ulong)local_100._4_4_ << 0x20);
  }
  bVar27 = Expression::isImplicitString(lhs);
  if (bVar27) {
    bVar27 = Expression::isImplicitString(rhs);
    uVar41 = (undefined4)CONCAT71(extraout_var_01,bVar27);
  }
  else {
    uVar41 = 0;
  }
  pCVar42 = local_128;
  pCVar31 = local_130;
  uVar49 = (undefined4)((ulong)args_5 >> 0x20);
  if (0x1b < (ulong)local_e0) {
    bVar28 = 0;
    goto LAB_00433ff3;
  }
  pTVar39 = (Type *)((long)&switchD_004338d4::switchdataD_004bc7ac +
                    (long)(int)(&switchD_004338d4::switchdataD_004bc7ac)[local_e0]);
  switch(local_e0) {
  case Add:
  case Subtract:
  case Multiply:
    bVar27 = false;
    goto LAB_00433caf;
  case Divide:
    bVar27 = true;
LAB_00433caf:
    pTVar39 = OpInfo::binaryType(pCVar1,(Type *)local_130,(Type *)local_128,bVar27,false);
    (expr->super_Expression).type.ptr = pTVar39;
LAB_00433cbb:
    bVar28 = (byte)local_100;
    break;
  case Mod:
    bVar27 = true;
    goto LAB_00433c8c;
  case BinaryAnd:
  case BinaryOr:
  case BinaryXor:
  case BinaryXnor:
    bVar27 = false;
LAB_00433c8c:
    pTVar39 = OpInfo::binaryType(pCVar1,(Type *)local_130,(Type *)local_128,bVar27,false);
    (expr->super_Expression).type.ptr = pTVar39;
    goto LAB_00433fef;
  default:
    if ((byte)local_100 == '\0') {
      local_120 = (Type *)CONCAT44(local_120._4_4_,
                                   CONCAT31((int3)(local_e0 - LogicalAnd >> 8),
                                            local_e0 - LogicalAnd < 0xfffffffe));
      local_118 = (char *)CONCAT44(local_118._4_4_,uVar41);
      if ((char)uVar41 == '\0') {
        bVar27 = Type::isAggregate((Type *)local_130);
        if ((bVar27) &&
           (bVar27 = Type::isEquivalent((Type *)local_130,(Type *)local_128), pCVar31 = local_128,
           bVar27)) {
          bVar27 = Type::isFourState((Type *)local_130);
          lVar38 = 0x150;
          if (!bVar27) {
            bVar27 = Type::isFourState((Type *)pCVar31);
            lVar38 = (ulong)bVar27 * 8 + 0x148;
          }
          (expr->super_Expression).type.ptr =
               *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar38);
          SVar43 = local_110;
          goto LAB_00433c71;
        }
        pCVar31 = local_130;
        lVar3._0_4_ = (local_130->options).typoCorrectionLimit;
        lVar3._4_4_ = (local_130->options).minTypMax;
        if (lVar3 == 0) {
          Type::resolveCanonical((Type *)local_130);
        }
        if ((**(int **)&(pCVar31->options).typoCorrectionLimit == 0x16) &&
           (bVar27 = Type::isAssignmentCompatible((Type *)local_130,(Type *)local_128), bVar27)) {
LAB_00433c5b:
          pTVar39 = pCVar1->bitType;
          (expr->super_Expression).type.ptr = pTVar39;
          local_120 = (Type *)CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)pTVar39 >> 8),1))
          ;
          SVar43 = local_110;
          goto LAB_00433c71;
        }
        pCVar31 = local_128;
        lVar4._0_4_ = (local_128->options).typoCorrectionLimit;
        lVar4._4_4_ = (local_128->options).minTypMax;
        if (lVar4 == 0) {
          Type::resolveCanonical((Type *)local_128);
        }
        if ((**(int **)&(pCVar31->options).typoCorrectionLimit == 0x16) &&
           (bVar27 = Type::isAssignmentCompatible((Type *)local_128,(Type *)local_130), bVar27))
        goto LAB_00433c5b;
        pCVar31 = local_130;
        lVar7._0_4_ = (local_130->options).typoCorrectionLimit;
        lVar7._4_4_ = (local_130->options).minTypMax;
        if (lVar7 == 0) {
          Type::resolveCanonical((Type *)local_130);
        }
        pCVar42 = local_130;
        cVar36 = (char)local_118;
        if (**(int **)&(pCVar31->options).typoCorrectionLimit == 0x1a) {
LAB_00433e44:
          pCVar31 = local_128;
          lVar9._0_4_ = (local_128->options).typoCorrectionLimit;
          lVar9._4_4_ = (local_128->options).minTypMax;
          if (lVar9 == 0) {
            Type::resolveCanonical((Type *)local_128);
            cVar36 = (char)local_118;
          }
          pCVar42 = local_128;
          if (**(int **)&(pCVar31->options).typoCorrectionLimit != 0x1a) {
            lVar10._0_4_ = (local_128->options).typoCorrectionLimit;
            lVar10._4_4_ = (local_128->options).minTypMax;
            if (lVar10 == 0) {
              Type::resolveCanonical((Type *)local_128);
              cVar36 = (char)local_118;
            }
            if (**(int **)&(pCVar42->options).typoCorrectionLimit != 0x19) goto LAB_00433e92;
          }
LAB_00433fba:
          pTVar39 = pCVar1->bitType;
          (expr->super_Expression).type.ptr = pTVar39;
          local_120 = (Type *)CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)pTVar39 >> 8),1))
          ;
          SVar43 = local_110;
        }
        else {
          lVar8._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar8._4_4_ = (local_130->options).minTypMax;
          if (lVar8 == 0) {
            Type::resolveCanonical((Type *)local_130);
            cVar36 = (char)local_118;
          }
          if (**(int **)&(pCVar42->options).typoCorrectionLimit == 0x19) goto LAB_00433e44;
LAB_00433e92:
          pCVar31 = local_130;
          lVar11._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar11._4_4_ = (local_130->options).minTypMax;
          if (lVar11 == 0) {
            Type::resolveCanonical((Type *)local_130);
            cVar36 = (char)local_118;
          }
          pCVar42 = local_130;
          if (**(int **)&(pCVar31->options).typoCorrectionLimit == 0x1c) {
LAB_00433ed8:
            pCVar31 = local_128;
            lVar13._0_4_ = (local_128->options).typoCorrectionLimit;
            lVar13._4_4_ = (local_128->options).minTypMax;
            if (lVar13 == 0) {
              Type::resolveCanonical((Type *)local_128);
              cVar36 = (char)local_118;
            }
            pCVar42 = local_128;
            if (**(int **)&(pCVar31->options).typoCorrectionLimit != 0x1c) {
              lVar14._0_4_ = (local_128->options).typoCorrectionLimit;
              lVar14._4_4_ = (local_128->options).minTypMax;
              if (lVar14 == 0) {
                Type::resolveCanonical((Type *)local_128);
                cVar36 = (char)local_118;
              }
              if (**(int **)&(pCVar42->options).typoCorrectionLimit != 0x19) goto LAB_00433f26;
            }
            goto LAB_00433fba;
          }
          lVar12._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar12._4_4_ = (local_130->options).minTypMax;
          if (lVar12 == 0) {
            Type::resolveCanonical((Type *)local_130);
            cVar36 = (char)local_118;
          }
          if (**(int **)&(pCVar42->options).typoCorrectionLimit == 0x19) goto LAB_00433ed8;
LAB_00433f26:
          pCVar31 = local_130;
          lVar15._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar15._4_4_ = (local_130->options).minTypMax;
          if (lVar15 == 0) {
            Type::resolveCanonical((Type *)local_130);
            cVar36 = (char)local_118;
          }
          pCVar42 = local_130;
          if (**(int **)&(pCVar31->options).typoCorrectionLimit == 0x17) {
LAB_00433f70:
            pCVar31 = local_128;
            lVar17._0_4_ = (local_128->options).typoCorrectionLimit;
            lVar17._4_4_ = (local_128->options).minTypMax;
            if (lVar17 == 0) {
              Type::resolveCanonical((Type *)local_128);
              cVar36 = (char)local_118;
            }
            pCVar42 = local_128;
            if (**(int **)&(pCVar31->options).typoCorrectionLimit != 0x17) {
              lVar18._0_4_ = (local_128->options).typoCorrectionLimit;
              lVar18._4_4_ = (local_128->options).minTypMax;
              if (lVar18 == 0) {
                Type::resolveCanonical((Type *)local_128);
                cVar36 = (char)local_118;
              }
              if (**(int **)&(pCVar42->options).typoCorrectionLimit != 0x19) goto LAB_004346f6;
            }
            goto LAB_00433fba;
          }
          lVar16._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar16._4_4_ = (local_130->options).minTypMax;
          if (lVar16 == 0) {
            Type::resolveCanonical((Type *)local_130);
            cVar36 = (char)local_118;
          }
          if (**(int **)&(pCVar42->options).typoCorrectionLimit == 0x19) goto LAB_00433f70;
LAB_004346f6:
          pCVar31 = local_130;
          lVar22._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar22._4_4_ = (local_130->options).minTypMax;
          if (lVar22 == 0) {
            Type::resolveCanonical((Type *)local_130);
          }
          if ((**(int **)&(pCVar31->options).typoCorrectionLimit == 0x22) &&
             (bVar27 = Type::isAssignmentCompatible((Type *)local_130,(Type *)local_128), bVar27))
          goto LAB_00433c5b;
          pCVar31 = local_128;
          lVar23._0_4_ = (local_128->options).typoCorrectionLimit;
          lVar23._4_4_ = (local_128->options).minTypMax;
          if (lVar23 == 0) {
            Type::resolveCanonical((Type *)local_128);
          }
          if ((**(int **)&(pCVar31->options).typoCorrectionLimit == 0x22) &&
             (bVar27 = Type::isAssignmentCompatible((Type *)local_128,(Type *)local_130), bVar27))
          goto LAB_00433c5b;
          pCVar31 = local_130;
          lVar24._0_4_ = (local_130->options).typoCorrectionLimit;
          lVar24._4_4_ = (local_130->options).minTypMax;
          if (lVar24 == 0) {
            Type::resolveCanonical((Type *)local_130);
          }
          pCVar42 = local_128;
          cVar36 = (char)local_118;
          if (**(int **)&(pCVar31->options).typoCorrectionLimit == 0x1e) {
            lVar25._0_4_ = (local_128->options).typoCorrectionLimit;
            lVar25._4_4_ = (local_128->options).minTypMax;
            if (lVar25 == 0) {
              Type::resolveCanonical((Type *)local_128);
              cVar36 = (char)local_118;
            }
            if (**(int **)&(pCVar42->options).typoCorrectionLimit != 0x1e) goto LAB_004347b8;
            (expr->super_Expression).type.ptr = pCVar1->bitType;
            SVar43 = local_110;
          }
          else {
LAB_004347b8:
            local_120 = (Type *)((ulong)local_120 & 0xffffffff00000000);
            SVar43 = local_110;
          }
        }
      }
      else {
        (expr->super_Expression).type.ptr = pCVar1->bitType;
        opRange_00.startLoc._4_4_ = uVar49;
        opRange_00.startLoc._0_4_ = 1;
        opRange_00.endLoc = in_stack_fffffffffffffe90;
        Expression::contextDetermined
                  ((Expression *)local_110,(ASTContext *)&expr->left_,(Expression **)expr,
                   (Expression *)pCVar1->stringType,(Type *)local_f8.first._M_len,opRange_00,
                   (ConversionKind)local_f8.first._M_str);
        SVar43 = local_110;
        opRange_01.startLoc._4_4_ = uVar49;
        opRange_01.startLoc._0_4_ = 1;
        opRange_01.endLoc = in_stack_fffffffffffffe90;
        Expression::contextDetermined
                  ((Expression *)local_110,(ASTContext *)&expr->right_,(Expression **)expr,
                   (Expression *)pCVar1->stringType,(Type *)local_f8.first._M_len,opRange_01,
                   (ConversionKind)local_f8.first._M_str);
LAB_00433c71:
        cVar36 = (char)local_118;
      }
      if (cVar36 == '\0') {
        Expression::selfDetermined((ASTContext *)SVar43,&expr->left_);
        goto LAB_00433fe0;
      }
    }
    else {
      uVar37 = (ulong)(local_e0 - Equality);
      if (local_e0 - Equality < 2) {
        bVar27 = Type::isFourState((Type *)local_130);
        local_120 = (Type *)CONCAT44(local_120._4_4_,(int)CONCAT71((int7)(uVar37 >> 8),1));
        lVar38 = 0x150;
        if (!bVar27) {
LAB_00433d63:
          bVar27 = Type::isFourState((Type *)pCVar42);
          lVar38 = (ulong)bVar27 * 8 + 0x148;
        }
      }
      else {
        pCVar42 = local_130;
        if (1 < local_e0 - CaseEquality) goto LAB_00433d63;
        local_120 = (Type *)CONCAT44(local_120._4_4_,
                                     (int)CONCAT71((uint7)(uint3)(local_e0 - CaseEquality >> 8),1));
        lVar38 = 0x148;
      }
      (expr->super_Expression).type.ptr =
           *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar38);
      local_100 = OpInfo::binaryType(pCVar1,(Type *)local_130,(Type *)local_128,false,false);
      SVar43 = local_110;
      opRange_05.startLoc._4_4_ = uVar49;
      opRange_05.startLoc._0_4_ = 1;
      opRange_05.endLoc = in_stack_fffffffffffffe90;
      Expression::contextDetermined
                ((Expression *)local_110,(ASTContext *)&expr->left_,(Expression **)expr,
                 (Expression *)local_100,(Type *)local_f8.first._M_len,opRange_05,
                 (ConversionKind)local_f8.first._M_str);
      opRange_06.startLoc._4_4_ = uVar49;
      opRange_06.startLoc._0_4_ = 1;
      opRange_06.endLoc = in_stack_fffffffffffffe90;
      Expression::contextDetermined
                ((Expression *)SVar43,(ASTContext *)&expr->right_,(Expression **)expr,
                 (Expression *)local_100,(Type *)local_f8.first._M_len,opRange_06,
                 (ConversionKind)local_f8.first._M_str);
    }
    goto LAB_00433fef;
  case GreaterThanEqual:
  case GreaterThan:
  case LessThanEqual:
  case LessThan:
    local_118 = (char *)CONCAT44(local_118._4_4_,uVar41);
    bVar27 = Type::isFourState((Type *)local_130);
    lVar38 = 0x150;
    if (!bVar27) {
      bVar27 = Type::isFourState((Type *)pCVar42);
      lVar38 = (ulong)bVar27 * 8 + 0x148;
    }
    (expr->super_Expression).type.ptr =
         *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar38);
    bVar28 = (byte)local_118;
    if (bVar28 == 1 && (byte)local_100 == '\0') {
      local_120 = pCVar1->stringType;
      local_b8 = rhs;
    }
    else {
      local_b8 = rhs;
      local_120 = OpInfo::binaryType(pCVar1,(Type *)local_130,(Type *)local_128,false,false);
      bVar28 = (byte)local_118;
    }
    SVar43 = local_110;
    bVar47 = (byte)local_100;
    opRange_02.startLoc._4_4_ = uVar49;
    opRange_02.startLoc._0_4_ = 1;
    opRange_02.endLoc = in_stack_fffffffffffffe90;
    Expression::contextDetermined
              ((Expression *)local_110,(ASTContext *)&expr->left_,(Expression **)expr,
               (Expression *)local_120,(Type *)local_f8.first._M_len,opRange_02,
               (ConversionKind)local_f8.first._M_str);
    opRange_03.startLoc._4_4_ = uVar49;
    opRange_03.startLoc._0_4_ = 1;
    opRange_03.endLoc = in_stack_fffffffffffffe90;
    Expression::contextDetermined
              ((Expression *)SVar43,(ASTContext *)&expr->right_,(Expression **)expr,
               (Expression *)local_120,(Type *)local_f8.first._M_len,opRange_03,
               (ConversionKind)local_f8.first._M_str);
    rhs = local_b8;
    bVar28 = bVar47 | bVar28;
    break;
  case LogicalAnd:
  case LogicalOr:
  case LogicalImplication:
  case LogicalEquivalence:
    bVar27 = Type::isFourState((Type *)local_130);
    lVar38 = 0x150;
    if (!bVar27) {
      bVar27 = Type::isFourState((Type *)pCVar42);
      lVar38 = (ulong)bVar27 * 8 + 0x148;
    }
    SVar43 = local_110;
    (expr->super_Expression).type.ptr =
         *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar38);
    local_120 = (Type *)&expr->left_;
    Expression::selfDetermined((ASTContext *)local_110,(Expression **)local_120);
    Expression::selfDetermined((ASTContext *)SVar43,&expr->right_);
    bVar28 = (byte)local_100;
    if ((byte)local_100 != 0) {
      local_b8 = rhs;
      ASTContext::requireBooleanConvertible
                ((ASTContext *)SVar43,*(Expression **)&local_120->super_Symbol);
      ASTContext::requireBooleanConvertible((ASTContext *)SVar43,expr->right_);
      rhs = local_b8;
    }
    break;
  case LogicalShiftLeft:
  case LogicalShiftRight:
  case ArithmeticShiftLeft:
  case ArithmeticShiftRight:
    bVar27 = Type::isFourState((Type *)local_128);
    pCVar31 = local_130;
    if (bVar27) {
      pCVar31 = (Compilation *)
                fromComponents::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)pCVar1,local_130,forceType);
    }
    (expr->super_Expression).type.ptr = (Type *)pCVar31;
LAB_00433fe0:
    Expression::selfDetermined((ASTContext *)SVar43,&expr->right_);
LAB_00433fef:
    bVar28 = (byte)local_120;
    break;
  case Power:
    lVar5._0_4_ = (local_130->options).typoCorrectionLimit;
    lVar5._4_4_ = (local_130->options).minTypMax;
    if (lVar5 == 0) {
      Type::resolveCanonical((Type *)local_130);
      pTVar39 = extraout_RDX;
    }
    pCVar42 = local_128;
    uVar41 = (undefined4)((ulong)args_5 >> 0x20);
    if (**(int **)&(pCVar31->options).typoCorrectionLimit == 9) {
LAB_00433d06:
      pTVar39 = OpInfo::binaryType(pCVar1,(Type *)local_130,(Type *)local_128,false,false);
      SVar43 = local_110;
      (expr->super_Expression).type.ptr = pTVar39;
      opRange_04.startLoc._4_4_ = uVar41;
      opRange_04.startLoc._0_4_ = 1;
      opRange_04.endLoc = in_stack_fffffffffffffe90;
      Expression::contextDetermined
                ((Expression *)local_110,(ASTContext *)&expr->right_,(Expression **)expr,
                 (Expression *)pTVar39,(Type *)local_f8.first._M_len,opRange_04,
                 (ConversionKind)local_f8.first._M_str);
    }
    else {
      lVar6._0_4_ = (local_128->options).typoCorrectionLimit;
      lVar6._4_4_ = (local_128->options).minTypMax;
      if (lVar6 == 0) {
        Type::resolveCanonical((Type *)local_128);
        pTVar39 = extraout_RDX_00;
      }
      uVar41 = (undefined4)((ulong)args_5 >> 0x20);
      if (**(int **)&(pCVar42->options).typoCorrectionLimit == 9) goto LAB_00433d06;
      pTVar39 = fromComponents::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)pCVar1,local_130,pTVar39);
      SVar43 = local_110;
      (expr->super_Expression).type.ptr = pTVar39;
      Expression::selfDetermined((ASTContext *)local_110,&expr->right_);
    }
    goto LAB_00433cbb;
  }
LAB_00433ff3:
  if (bVar28 == 0) {
    sourceRange_01.endLoc = (SourceLocation)local_f8.first._M_str;
    sourceRange_01.startLoc = (SourceLocation)local_f8.first._M_len;
    pDVar33 = ASTContext::addDiag((ASTContext *)SVar43,(DiagCode)0x1f0007,sourceRange_01);
    pDVar35 = ast::operator<<(pDVar33,(Type *)local_130);
    ast::operator<<(pDVar35,(Type *)local_128);
    Diagnostic::operator<<(pDVar33,lhs->sourceRange);
    Diagnostic::operator<<(pDVar33,rhs->sourceRange);
LAB_004340dd:
    expr = (BinaryExpression *)Expression::badExpr(pCVar1,&expr->super_Expression);
  }
  else {
    local_d9._1_8_ = local_f8.first._M_len;
    SStack_d0 = (SourceLocation)local_f8.first._M_str;
    local_104 = local_e0;
    if (lhs->kind != LValueReference) {
      bVar27 = OpInfo::isBitwise(local_e0);
      if (bVar27) {
        bVar27 = Expression::isParenthesized(lhs);
        bVar29 = false;
        pEVar45 = (Expression *)0x0;
        if (lhs->kind == BinaryOp) {
          pEVar45 = lhs;
        }
        if (bVar27) {
          pEVar45 = (Expression *)0x0;
        }
        bVar27 = Expression::isParenthesized(rhs);
        pEVar34 = (Expression *)0x0;
        if (rhs->kind == BinaryOp) {
          pEVar34 = rhs;
        }
        if (bVar27) {
          pEVar34 = (Expression *)0x0;
        }
        if (pEVar45 == (Expression *)0x0) {
          local_100 = (Type *)0x0;
        }
        else {
          bVar27 = OpInfo::isComparison(*(BinaryOperator *)((long)(pEVar45 + 1) + 0x10));
          local_100 = (Type *)CONCAT71(extraout_var_02,bVar27);
        }
        if (pEVar34 != (Expression *)0x0) {
          bVar29 = OpInfo::isComparison(*(BinaryOperator *)((long)(pEVar34 + 1) + 0x10));
        }
        if (bVar29 != (bool)(byte)local_100) {
          if (pEVar45 == (Expression *)0x0) {
            bVar27 = false;
          }
          else {
            bVar27 = OpInfo::isBitwise(*(BinaryOperator *)((long)(pEVar45 + 1) + 0x10));
          }
          if (pEVar34 == (Expression *)0x0) {
            local_120 = (Type *)((ulong)local_120 & 0xffffffff00000000);
          }
          else {
            bVar29 = OpInfo::isBitwise(*(BinaryOperator *)((long)(pEVar34 + 1) + 0x10));
            local_120 = (Type *)CONCAT44(local_120._4_4_,(int)CONCAT71(extraout_var_03,bVar29));
          }
          bVar29 = Type::isIntegral((lhs->type).ptr);
          if (((bVar29) && (bVar30 = Type::getBitWidth((lhs->type).ptr), bVar30 == 1)) &&
             (bVar29 = Type::isIntegral((rhs->type).ptr), bVar29)) {
            bVar30 = Type::getBitWidth((rhs->type).ptr);
            bVar29 = bVar30 == 1;
          }
          else {
            bVar29 = false;
          }
          if ((bVar27 == false && (char)local_120 == '\0') && (!bVar29)) {
            sVar48 = OpInfo::getText(local_104);
            local_118 = sVar48._M_str;
            local_b0 = sVar48._M_len;
            local_80 = (SourceLocation)&lhs->sourceRange;
            pEVar32 = pEVar34;
            if ((byte)local_100 != '\0') {
              pEVar32 = pEVar45;
            }
            local_c0 = (Diagnostic *)&rhs->sourceRange;
            pEVar26 = rhs;
            if ((byte)local_100 != '\0') {
              local_c0 = (Diagnostic *)local_80;
              pEVar26 = lhs;
            }
            sVar48 = OpInfo::getText(*(BinaryOperator *)((long)(pEVar32 + 1) + 0x10));
            local_a0 = sVar48._M_str;
            local_120 = (Type *)sVar48._M_len;
            local_a8 = (pEVar26->sourceRange).startLoc;
            local_78 = *(SourceLocation *)((long)local_c0 + 8);
            sourceRange_02.endLoc = SStack_d0;
            sourceRange_02.startLoc = (SourceLocation)local_d9._1_8_;
            local_c0 = ASTContext::addDiag((ASTContext *)local_110,(DiagCode)0xb80007,sourceRange_02
                                          );
            sVar48._M_str = local_118;
            sVar48._M_len = local_b0;
            pDVar33 = Diagnostic::operator<<(local_c0,sVar48);
            pcVar44 = local_a0;
            arg._M_str = local_a0;
            arg._M_len = (size_t)local_120;
            pDVar33 = Diagnostic::operator<<(pDVar33,arg);
            arg_00._M_str = pcVar44;
            arg_00._M_len = (size_t)local_120;
            pDVar33 = Diagnostic::operator<<(pDVar33,arg_00);
            SVar43 = local_78;
            range_03.endLoc = local_78;
            range_03.startLoc = local_a8;
            Diagnostic::operator<<(pDVar33,range_03);
            pDVar33 = local_c0;
            if ((byte)local_100 == '\0') {
              pEVar34 = *(Expression **)(pEVar34 + 1);
              SVar40 = local_80;
            }
            else {
              pEVar34 = rhs;
              SVar40 = (SourceLocation)(*(long *)((long)(pEVar45 + 1) + 8) + 0x20);
            }
            range_00.endLoc = *(SourceLocation *)((long)&pEVar34->sourceRange + 8);
            range_00.startLoc = *(SourceLocation *)SVar40;
            pDVar35 = Diagnostic::addNote(local_c0,(DiagCode)0xb20007,range_00);
            arg_01._M_str = local_118;
            arg_01._M_len = local_b0;
            Diagnostic::operator<<(pDVar35,arg_01);
            range_01.endLoc = SVar43;
            range_01.startLoc = local_a8;
            pDVar33 = Diagnostic::addNote(pDVar33,(DiagCode)0xb30007,range_01);
            arg_02._M_str = local_a0;
            arg_02._M_len = (size_t)local_120;
            Diagnostic::operator<<(pDVar33,arg_02);
          }
        }
      }
      local_98 = local_110;
      local_88 = local_d9 + 1;
      SStack_90 = (SourceLocation)&local_104;
      if (local_104 - BinaryOr < 3) {
        local_70.lt = (Type **)&local_98;
        local_70.clt = (Type *)local_d9;
        local_70.crt = (Type *)&local_104;
        analyzePrecedence::anon_class_24_3_21991733::operator()
                  ((anon_class_24_3_21991733 *)&local_70,lhs);
        analyzePrecedence::anon_class_24_3_21991733::operator()
                  ((anon_class_24_3_21991733 *)&local_70,rhs);
      }
      if (local_104 == LogicalOr) {
        local_70.crt = (Type *)&local_98;
        local_70.clt = (Type *)local_d9;
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&local_70,lhs);
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&local_70,rhs);
      }
      bVar27 = OpInfo::isShift(local_104);
      if (bVar27) {
        local_70.crt = (Type *)local_110;
        local_70.rt = (Type **)(local_d9 + 1);
        local_70.clt = (Type *)local_d9;
        local_70.lt = (Type **)&local_104;
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&local_70,lhs);
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&local_70,rhs);
      }
      bVar27 = OpInfo::isComparison(local_104);
      if (((local_104 == BinaryAnd || bVar27) && (lhs->kind == UnaryOp)) &&
         ((bVar27 = Expression::isParenthesized(lhs), !bVar27 && (lhs[1].kind == HierarchicalValue))
         )) {
        pEVar19 = lhs[1].syntax;
        bVar27 = Type::isIntegral((Type *)(pEVar19->super_SyntaxNode).parent);
        if (((!bVar27) ||
            (bVar30 = Type::getBitWidth((Type *)(pEVar19->super_SyntaxNode).parent), bVar30 != 1))
           && ((bVar27 = Type::isIntegral((rhs->type).ptr), !bVar27 ||
               (bVar30 = Type::getBitWidth((rhs->type).ptr), bVar30 != 1)))) {
          pcVar44 = "comparison";
          if (local_104 == BinaryAnd) {
            pcVar44 = "bitwise operator";
          }
          sVar46 = 10;
          if (local_104 == BinaryAnd) {
            sVar46 = 0x10;
          }
          sourceRange_00.startLoc = *(SourceLocation *)&lhs[1].type;
          sourceRange_00.endLoc = (SourceLocation)lhs[1].constant;
          pDVar33 = ASTContext::addDiag((ASTContext *)local_110,(DiagCode)0xc80007,sourceRange_00);
          arg_03._M_str = pcVar44;
          arg_03._M_len = sVar46;
          pDVar35 = Diagnostic::operator<<(pDVar33,arg_03);
          range.endLoc = SStack_d0;
          range.startLoc = (SourceLocation)local_d9._1_8_;
          Diagnostic::operator<<(pDVar35,range);
          range_02.endLoc = *(SourceLocation *)((long)&rhs->sourceRange + 8);
          range_02.startLoc = (SourceLocation)lhs[1].syntax[1].super_SyntaxNode.parent;
          pDVar35 = Diagnostic::addNote(pDVar33,(DiagCode)0xb00007,range_02);
          arg_04._M_str = pcVar44;
          arg_04._M_len = sVar46;
          Diagnostic::operator<<(pDVar35,arg_04);
          Diagnostic::addNote(pDVar33,(DiagCode)0xb10007,lhs->sourceRange);
        }
      }
      bVar27 = OpInfo::isRelational(local_104);
      if ((((bVar27) && (bVar27 = Expression::isParenthesized(lhs), !bVar27)) &&
          (lhs->kind == BinaryOp)) &&
         (bVar27 = OpInfo::isRelational(*(BinaryOperator *)&lhs[1].constant), bVar27)) {
        sourceRange_03.endLoc = SStack_d0;
        sourceRange_03.startLoc = (SourceLocation)local_d9._1_8_;
        ASTContext::addDiag((ASTContext *)local_110,(DiagCode)0xbd0007,sourceRange_03);
      }
    }
    pCVar1 = local_130;
    lVar20._0_4_ = (local_130->options).typoCorrectionLimit;
    lVar20._4_4_ = (local_130->options).minTypMax;
    if (lVar20 == 0) {
      Type::resolveCanonical((Type *)local_130);
    }
    pCVar31 = local_128;
    pTVar39 = *(Type **)&(pCVar1->options).typoCorrectionLimit;
    lVar21._0_4_ = (local_128->options).typoCorrectionLimit;
    lVar21._4_4_ = (local_128->options).minTypMax;
    if (lVar21 == 0) {
      Type::resolveCanonical((Type *)local_128);
    }
    rhs_00 = *(Type **)&(pCVar31->options).typoCorrectionLimit;
    bVar27 = Type::isMatching(pTVar39,rhs_00);
    if (!bVar27) {
      local_70.lt = (Type **)&local_130;
      local_70.rt = (Type **)&local_128;
      local_70.context = (ASTContext *)local_110;
      local_70.opRange = (SourceRange *)&local_f8;
      if (local_e0 < LogicalAnd) {
        local_70.clt = pTVar39;
        local_70.crt = rhs_00;
        local_70.lhs = lhs;
        local_70.rhs = rhs;
        if ((0x7fe00U >> (local_e0 & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
          if ((0x1fU >> (local_e0 & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
            code.subsystem = Expressions;
            code.code = 0xb6;
          }
          else {
            code.subsystem = Expressions;
            code.code = 0xb5;
          }
          fromComponents::anon_class_64_8_451f4118::operator()(&local_70,code,false);
        }
        else {
          local_88 = (char *)((ulong)local_88 & 0xffffffffffffff00);
          opRange_07.endLoc = (SourceLocation)local_f8.first._M_str;
          opRange_07.startLoc = (SourceLocation)local_f8.first._M_len;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_str = (char *)SStack_90;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len = (size_t)local_98;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _16_8_ = local_88;
          analyzeOpTypes(pTVar39,rhs_00,(Type *)local_130,(Type *)local_128,lhs,rhs,
                         (ASTContext *)local_110,opRange_07,(DiagCode)0xbb0007,true,extraDiagArg);
        }
      }
    }
  }
  return &expr->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceRange opRange, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange, opRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return OpInfo::binaryType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good = false;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, result, *result->type, opRange);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : OpInfo::binaryType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, result, *nt, opRange);
            contextDetermined(context, result->right_, result, *nt, opRange);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            if (good) {
                // Call this just to get warnings about boolean conversions.
                context.requireBooleanConvertible(*result->left_);
                context.requireBooleanConvertible(*result->right_);
            }
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, result, *nt, opRange);
                contextDetermined(context, result->right_, result, *nt, opRange);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, result, compilation.getStringType(),
                                      opRange);
                    contextDetermined(context, result->right_, result, compilation.getStringType(),
                                      opRange);
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt)) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opRange);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    analyzePrecedence(context, lhs, rhs, op, opRange);

    auto& clt = lt->getCanonicalType();
    auto& crt = rt->getCanonicalType();
    if (!clt.isMatching(crt)) {
        auto checkTypes = [&](DiagCode code, bool isComparison) {
            analyzeOpTypes(clt, crt, *lt, *rt, lhs, rhs, context, opRange, code, isComparison, {});
        };

        switch (op) {
            case BinaryOperator::Add:
            case BinaryOperator::Subtract:
            case BinaryOperator::Multiply:
            case BinaryOperator::Divide:
            case BinaryOperator::Mod:
                checkTypes(diag::ArithOpMismatch, false);
                break;
            case BinaryOperator::BinaryAnd:
            case BinaryOperator::BinaryOr:
            case BinaryOperator::BinaryXor:
            case BinaryOperator::BinaryXnor:
                checkTypes(diag::BitwiseOpMismatch, false);
                break;
            case BinaryOperator::Equality:
            case BinaryOperator::Inequality:
            case BinaryOperator::CaseEquality:
            case BinaryOperator::CaseInequality:
            case BinaryOperator::GreaterThanEqual:
            case BinaryOperator::GreaterThan:
            case BinaryOperator::LessThanEqual:
            case BinaryOperator::LessThan:
            case BinaryOperator::WildcardEquality:
            case BinaryOperator::WildcardInequality:
                checkTypes(diag::ComparisonMismatch, true);
                break;
            default:
                // Remaining operations have self determined
                // operands so the warning wouldn't make sense.
                break;
        }
    }

    return *result;
}